

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O0

void baryonyx::context_register
               (context_ptr *ctx,solver_started_cb *start,solver_updated_cb *update,
               solver_finished_cb *finish)

{
  bool bVar1;
  pointer pcVar2;
  solver_finished_cb *finish_local;
  solver_updated_cb *update_local;
  solver_started_cb *start_local;
  context_ptr *ctx_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)ctx);
  if (bVar1) {
    pcVar2 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->(ctx);
    std::function<void_(const_baryonyx::solver_parameters_&)>::operator=(&pcVar2->start,start);
    pcVar2 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->(ctx);
    std::function<void_(int,_double,_long,_double,_long)>::operator=(&pcVar2->update,update);
    pcVar2 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->(ctx);
    std::function<void_(const_baryonyx::result_&)>::operator=(&pcVar2->finish,finish);
  }
  return;
}

Assistant:

void
context_register(const context_ptr& ctx,
                 solver_started_cb start,
                 solver_updated_cb update,
                 solver_finished_cb finish)
{
    if (ctx) {
        ctx->start = std::move(start);
        ctx->update = std::move(update);
        ctx->finish = std::move(finish);
    }
}